

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprMightBeIndexed2(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int j)

{
  int iTab;
  Index *pIVar1;
  int iVar2;
  Index **ppIVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)j;
  do {
    iTab = pFrom->a[lVar5].iCursor;
    ppIVar3 = &(pFrom->a[lVar5].pSTab)->pIndex;
    while (pIVar1 = *ppIVar3, pIVar1 != (Index *)0x0) {
      if (pIVar1->aColExpr != (ExprList *)0x0) {
        lVar6 = 4;
        for (uVar4 = 0; uVar4 < pIVar1->nKeyCol; uVar4 = uVar4 + 1) {
          if (((pIVar1->aiColumn[uVar4] == -2) &&
              (iVar2 = sqlite3ExprCompareSkip
                                 (pExpr,*(Expr **)((long)pIVar1->aColExpr->a + lVar6 * 2 + -8),iTab)
              , iVar2 == 0)) &&
             (iVar2 = sqlite3ExprIsConstant
                                ((Parse *)0x0,*(Expr **)((long)pIVar1->aColExpr->a + lVar6 * 2 + -8)
                                ), iVar2 == 0)) {
            *aiCurCol = iTab;
            aiCurCol[1] = -2;
            return 1;
          }
          lVar6 = lVar6 + 0xc;
        }
      }
      ppIVar3 = &pIVar1->pNext;
    }
    lVar5 = lVar5 + 1;
    if (pFrom->nSrc <= lVar5) {
      return 0;
    }
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int j                  /* Start looking with the j-th pFrom entry */
){
  Index *pIdx;
  int i;
  int iCur;
  do{
    iCur = pFrom->a[j].iCursor;
    for(pIdx=pFrom->a[j].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr==0 ) continue;
      for(i=0; i<pIdx->nKeyCol; i++){
        if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
        assert( pIdx->bHasExpr );
        if( sqlite3ExprCompareSkip(pExpr,pIdx->aColExpr->a[i].pExpr,iCur)==0
         && !sqlite3ExprIsConstant(0,pIdx->aColExpr->a[i].pExpr)
        ){
          aiCurCol[0] = iCur;
          aiCurCol[1] = XN_EXPR;
          return 1;
        }
      }
    }
  }while( ++j < pFrom->nSrc );
  return 0;
}